

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_pos(CTcPrsNode *subexpr)

{
  int iVar1;
  tc_constval_type_t tVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  CTcPrsNode *in_RDI;
  CTPNPos *in_stack_ffffffffffffffe0;
  CTcPrsNode *local_8;
  
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2a98d3);
  if (iVar1 == 0) {
    local_8 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2a9946);
    CTPNPos::CTPNPos(in_stack_ffffffffffffffe0,local_8);
  }
  else {
    iVar1 = (*(in_RDI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    tVar2 = CTcConstVal::get_type((CTcConstVal *)CONCAT44(extraout_var,iVar1));
    local_8 = in_RDI;
    if (tVar2 != TC_CVT_FLOAT) {
      iVar1 = (*(in_RDI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
      tVar2 = CTcConstVal::get_type((CTcConstVal *)CONCAT44(extraout_var_00,iVar1));
      if (tVar2 != TC_CVT_INT) {
        pcVar3 = CTcTokenizer::get_op_text(TOKT_PLUS);
        CTcTokenizer::log_error(0x2b01,pcVar3);
      }
    }
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_pos(CTcPrsNode *subexpr)
{
    /* 
     *   if the underlying expression is a constant value, apply the
     *   operator 
     */
    if (subexpr->is_const())
    {
        /* if it's a float, a unary '+' has no effect at all */
        if (subexpr->get_const_val()->get_type() == TC_CVT_FLOAT)
            return subexpr;

        /* we need an integer - log an error if it's not */
        if (subexpr->get_const_val()->get_type() != TC_CVT_INT)
            G_tok->log_error(TCERR_CONST_UNARY_REQ_NUM,
                             G_tok->get_op_text(TOKT_PLUS));

        /* 
         *   positive-ing a value doesn't change the value, so return the
         *   original constant 
         */
        return subexpr;
    }
    
    /* create the unary positive node */
    return new CTPNPos(subexpr);
}